

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

xmlChar * xmlEncodeSpecialChars(xmlDoc *doc,xmlChar *input)

{
  ulong uVar1;
  xmlChar *pxVar2;
  size_t new_size;
  xmlChar *tmp;
  size_t indx;
  size_t buffer_size;
  xmlChar *out;
  xmlChar *buffer;
  xmlChar *cur;
  xmlChar *input_local;
  xmlDoc *doc_local;
  
  if (input == (xmlChar *)0x0) {
    doc_local = (xmlDoc *)0x0;
  }
  else {
    indx = 1000;
    buffer_size = (size_t)(*xmlMalloc)(1000);
    out = (xmlChar *)buffer_size;
    buffer = input;
    if ((xmlChar *)buffer_size == (xmlChar *)0x0) {
      xmlEntitiesErrMemory("xmlEncodeSpecialChars: malloc failed");
      doc_local = (xmlDoc *)0x0;
    }
    else {
      for (; *buffer != '\0'; buffer = buffer + 1) {
        if (indx < (buffer_size - (long)out) + 10) {
          uVar1 = indx << 1;
          if ((uVar1 < indx) ||
             (pxVar2 = (xmlChar *)(*xmlRealloc)(out,uVar1), pxVar2 == (xmlChar *)0x0)) {
            xmlEntitiesErrMemory("xmlEncodeSpecialChars: realloc failed");
            (*xmlFree)(out);
            return (xmlChar *)0x0;
          }
          buffer_size = (size_t)(pxVar2 + (buffer_size - (long)out));
          indx = uVar1;
          out = pxVar2;
        }
        if (*buffer == '<') {
          *(undefined1 *)buffer_size = 0x26;
          *(undefined1 *)(buffer_size + 1) = 0x6c;
          *(undefined1 *)(buffer_size + 2) = 0x74;
          *(undefined1 *)(buffer_size + 3) = 0x3b;
          buffer_size = buffer_size + 4;
        }
        else if (*buffer == '>') {
          *(undefined1 *)buffer_size = 0x26;
          *(undefined1 *)(buffer_size + 1) = 0x67;
          *(undefined1 *)(buffer_size + 2) = 0x74;
          *(undefined1 *)(buffer_size + 3) = 0x3b;
          buffer_size = buffer_size + 4;
        }
        else if (*buffer == '&') {
          *(undefined1 *)buffer_size = 0x26;
          *(undefined1 *)(buffer_size + 1) = 0x61;
          *(undefined1 *)(buffer_size + 2) = 0x6d;
          *(undefined1 *)(buffer_size + 3) = 0x70;
          *(undefined1 *)(buffer_size + 4) = 0x3b;
          buffer_size = buffer_size + 5;
        }
        else if (*buffer == '\"') {
          *(undefined1 *)buffer_size = 0x26;
          *(undefined1 *)(buffer_size + 1) = 0x71;
          *(undefined1 *)(buffer_size + 2) = 0x75;
          *(undefined1 *)(buffer_size + 3) = 0x6f;
          *(undefined1 *)(buffer_size + 4) = 0x74;
          *(undefined1 *)(buffer_size + 5) = 0x3b;
          buffer_size = buffer_size + 6;
        }
        else if (*buffer == '\r') {
          *(undefined1 *)buffer_size = 0x26;
          *(undefined1 *)(buffer_size + 1) = 0x23;
          *(undefined1 *)(buffer_size + 2) = 0x31;
          *(undefined1 *)(buffer_size + 3) = 0x33;
          *(undefined1 *)(buffer_size + 4) = 0x3b;
          buffer_size = buffer_size + 5;
        }
        else {
          *(xmlChar *)buffer_size = *buffer;
          buffer_size = buffer_size + 1;
        }
      }
      *(undefined1 *)buffer_size = 0;
      doc_local = (xmlDoc *)out;
    }
  }
  return (xmlChar *)doc_local;
}

Assistant:

xmlChar *
xmlEncodeSpecialChars(const xmlDoc *doc ATTRIBUTE_UNUSED, const xmlChar *input) {
    const xmlChar *cur = input;
    xmlChar *buffer = NULL;
    xmlChar *out = NULL;
    size_t buffer_size = 0;
    if (input == NULL) return(NULL);

    /*
     * allocate an translation buffer.
     */
    buffer_size = 1000;
    buffer = (xmlChar *) xmlMalloc(buffer_size * sizeof(xmlChar));
    if (buffer == NULL) {
        xmlEntitiesErrMemory("xmlEncodeSpecialChars: malloc failed");
	return(NULL);
    }
    out = buffer;

    while (*cur != '\0') {
        size_t indx = out - buffer;
        if (indx + 10 > buffer_size) {

	    growBufferReentrant();
	    out = &buffer[indx];
	}

	/*
	 * By default one have to encode at least '<', '>', '"' and '&' !
	 */
	if (*cur == '<') {
	    *out++ = '&';
	    *out++ = 'l';
	    *out++ = 't';
	    *out++ = ';';
	} else if (*cur == '>') {
	    *out++ = '&';
	    *out++ = 'g';
	    *out++ = 't';
	    *out++ = ';';
	} else if (*cur == '&') {
	    *out++ = '&';
	    *out++ = 'a';
	    *out++ = 'm';
	    *out++ = 'p';
	    *out++ = ';';
	} else if (*cur == '"') {
	    *out++ = '&';
	    *out++ = 'q';
	    *out++ = 'u';
	    *out++ = 'o';
	    *out++ = 't';
	    *out++ = ';';
	} else if (*cur == '\r') {
	    *out++ = '&';
	    *out++ = '#';
	    *out++ = '1';
	    *out++ = '3';
	    *out++ = ';';
	} else {
	    /*
	     * Works because on UTF-8, all extended sequences cannot
	     * result in bytes in the ASCII range.
	     */
	    *out++ = *cur;
	}
	cur++;
    }
    *out = 0;
    return(buffer);

mem_error:
    xmlEntitiesErrMemory("xmlEncodeSpecialChars: realloc failed");
    xmlFree(buffer);
    return(NULL);
}